

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O0

void __thiscall wallet::walletload_tests::wallet_load_ckey::test_method(wallet_load_ckey *this)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  LegacyScriptPubKeyMan *pLVar5;
  WalletDatabase *chain;
  lazy_ostream *database;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *__s;
  const_string *file;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffee88;
  lazy_ostream *in_stack_ffffffffffffee90;
  char *in_stack_ffffffffffffee98;
  size_type in_stack_ffffffffffffeea0;
  undefined4 in_stack_ffffffffffffeea8;
  int in_stack_ffffffffffffeeac;
  lazy_ostream *in_stack_ffffffffffffeeb0;
  LegacyDataSPKM *in_stack_ffffffffffffeeb8;
  CWallet *pCVar6;
  const_string *in_stack_ffffffffffffeec0;
  allocator<char> *in_stack_ffffffffffffeec8;
  allocator<char> *__a;
  CPubKey *in_stack_ffffffffffffeed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeed8;
  undefined7 in_stack_ffffffffffffeee0;
  undefined1 in_stack_ffffffffffffeee7;
  SigningProvider *in_stack_ffffffffffffeee8;
  string *in_stack_ffffffffffffef08;
  WalletDatabase *in_stack_ffffffffffffef10;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffef20;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *__x;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffef28;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_ffffffffffffef98;
  undefined7 in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa7;
  Chain *in_stack_ffffffffffffefa8;
  CWallet *in_stack_ffffffffffffefb0;
  SecureString *in_stack_ffffffffffffefd8;
  undefined7 in_stack_ffffffffffffefe0;
  undefined1 in_stack_ffffffffffffefe7;
  LegacyScriptPubKeyMan *legacy_spkm;
  wallet_load_ckey *this_local;
  lazy_ostream local_d90;
  undefined1 local_d78 [79];
  allocator<char> local_d29;
  shared_ptr<wallet::CWallet> wallet_4;
  SerializeData key;
  const_string local_d00 [2];
  lazy_ostream local_ce0 [2];
  assertion_result local_cc0 [2];
  lazy_ostream local_c88;
  undefined1 local_c70 [79];
  undefined1 local_c21;
  shared_ptr<wallet::CWallet> wallet_3;
  const_string local_c10 [2];
  lazy_ostream local_bf0 [2];
  assertion_result local_bd0 [2];
  const_string local_b98 [2];
  lazy_ostream local_b78 [2];
  assertion_result local_b50 [2];
  const_string local_b18 [2];
  lazy_ostream local_af8 [2];
  assertion_result local_ad8 [2];
  const_string local_aa0 [2];
  lazy_ostream local_a80 [2];
  assertion_result local_a60 [2];
  const_string local_a28 [2];
  lazy_ostream local_a08 [2];
  assertion_result local_9e8 [2];
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  assertion_result local_970 [2];
  lazy_ostream local_938;
  undefined1 local_920 [79];
  allocator<char> local_8d1;
  shared_ptr<wallet::CWallet> wallet_2;
  const_string local_8c0 [2];
  lazy_ostream local_8a0 [2];
  assertion_result local_880 [2];
  const_string local_848 [2];
  lazy_ostream local_828 [2];
  assertion_result local_800 [2];
  const_string local_7c8 [2];
  lazy_ostream local_7a8 [2];
  assertion_result local_788 [2];
  const_string local_750 [2];
  lazy_ostream local_730 [2];
  assertion_result local_710 [2];
  const_string local_6d8 [2];
  lazy_ostream local_6b8 [2];
  assertion_result local_698 [2];
  const_string local_660 [2];
  lazy_ostream local_640 [2];
  assertion_result local_620 [2];
  lazy_ostream local_5e8;
  undefined1 local_5d0 [79];
  allocator<char> local_581;
  shared_ptr<wallet::CWallet> wallet_1;
  const_string local_558 [2];
  lazy_ostream local_538 [2];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [2];
  assertion_result local_498 [2];
  CKey first_key;
  const_string local_450 [2];
  lazy_ostream local_430 [2];
  assertion_result local_410 [2];
  allocator<char> local_3c9;
  shared_ptr<wallet::CWallet> wallet;
  SerializeData ckey_record_value;
  SerializeData ckey_record_key;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  CPubKey invalid_key;
  CKeyID key_id;
  undefined1 local_130 [88];
  CTxDestination dest;
  MockableData records;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee88);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88);
  operator_new(0x4a8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffee98);
  CWallet::CWallet(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
                   (string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   in_stack_ffffffffffffef98);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88,(CWallet *)0xe70f30);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::~allocator(&local_3c9);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee88);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffee88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffeec8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffeec0,
             (char *)in_stack_ffffffffffffeeb8,(char *)in_stack_ffffffffffffeeb0,
             in_stack_ffffffffffffeeac,SUB41((uint)in_stack_ffffffffffffeea8 >> 0x18,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee88);
  pLVar5 = CWallet::GetOrCreateLegacyScriptPubKeyMan((CWallet *)in_stack_ffffffffffffee98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    (*(pLVar5->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb])(pLVar5,1);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_410,local_430,local_450,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  (*(pLVar5->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[2])
            (local_130,pLVar5,0);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20),(char *)in_stack_ffffffffffffeeb0,
             (char *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_ffffffffffffee88);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_ffffffffffffee88,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xe711d2);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_ffffffffffffee88);
  GetKeyForDestination
            (in_stack_ffffffffffffeee8,
             (CTxDestination *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
  CKey::CKey((CKey *)in_stack_ffffffffffffee88);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    (*(pLVar5->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
              (pLVar5,&key_id,&first_key);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_498,local_4b8,local_4d8,0x84,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
    basic_string<secure_allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffeeb8,(char *)in_stack_ffffffffffffeeb0,
               (secure_allocator<char> *)
               CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    CWallet::EncryptWallet
              ((CWallet *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
               in_stack_ffffffffffffefd8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_538,local_558,0x87,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee88);
  CWallet::Flush((CWallet *)in_stack_ffffffffffffee88);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee98);
  GetMockableDatabase((CWallet *)in_stack_ffffffffffffee88);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::operator=((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)in_stack_ffffffffffffee98,
              (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)in_stack_ffffffffffffee90);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffeeb0);
  MakeSerializeData<std::__cxx11::string,CPubKey>
            (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee98,
             (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::at((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        *)in_stack_ffffffffffffeeb0,
       (key_type *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
            (in_stack_ffffffffffffef28,in_stack_ffffffffffffef20);
  CKey::~CKey((CKey *)in_stack_ffffffffffffee88);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffee88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffee88);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88);
  operator_new(0x4a8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88,
        (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)0xe716e0);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffee98);
  CWallet::CWallet(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
                   (string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   in_stack_ffffffffffffef98);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88,(CWallet *)0xe7173d);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::~allocator(&local_581);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffee90,(char (*) [1])in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    local_5e8._vptr_lazy_ostream._4_4_ =
         CWallet::LoadWallet((CWallet *)
                             CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
    local_5e8._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffee98 = "DBErrors::LOAD_OK";
    in_stack_ffffffffffffee90 = &local_5e8;
    in_stack_ffffffffffffee88 = "wallet->LoadWallet()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
              (local_5d0,&local_5e8.m_empty,0x9b,1,2,
               (undefined1 *)((long)&local_5e8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::IsCrypted((CWallet *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_640,local_660,0x9c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_698,local_6b8,local_6d8,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetLegacyScriptPubKeyMan
              ((CWallet *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    LegacyDataSPKM::DeleteRecords(in_stack_ffffffffffffeeb8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_710,local_730,local_750,0xa0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_788,local_7a8,local_7c8,0xa1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
    basic_string<secure_allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffeeb8,(char *)in_stack_ffffffffffffeeb0,
               (secure_allocator<char> *)
               CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    CWallet::Unlock((CWallet *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                    (SecureString *)in_stack_ffffffffffffeed8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_800,local_828,local_848,0xa2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_880,local_8a0,local_8c0,0xa3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (key_type *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
             CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),in_stack_ffffffffffffeea0
            );
  operator_new(0x4a8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88,
        (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)0xe722f2);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffee98);
  CWallet::CWallet(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
                   (string *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   in_stack_ffffffffffffef98);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88,(CWallet *)0xe7234f);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::~allocator(&local_8d1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffee90,(char (*) [1])in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    local_938._vptr_lazy_ostream._4_4_ =
         CWallet::LoadWallet((CWallet *)
                             CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
    local_938._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffee98 = "DBErrors::LOAD_OK";
    in_stack_ffffffffffffee90 = &local_938;
    in_stack_ffffffffffffee88 = "wallet->LoadWallet()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
              (local_920,&local_938.m_empty,0xaf,1,2,
               (undefined1 *)((long)&local_938._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::IsCrypted((CWallet *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_990,local_9b0,0xb0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a08,local_a28,0xb1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetLegacyScriptPubKeyMan
              ((CWallet *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    LegacyDataSPKM::DeleteRecords(in_stack_ffffffffffffeeb8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a60,local_a80,local_aa0,0xb5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    pCVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    chain = CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    uVar3 = HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    database = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ad8,local_af8,local_b18,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
    basic_string<secure_allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffeeb8,(char *)in_stack_ffffffffffffeeb0,
               (secure_allocator<char> *)
               CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    CWallet::Unlock((CWallet *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                    (SecureString *)in_stack_ffffffffffffeed8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b50,local_b78,local_b98,0xb7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    CWallet::GetDatabase((CWallet *)in_stack_ffffffffffffee98);
    HasAnyRecordOfType(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bd0,local_bf0,local_c10,0xb8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (key_type *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
             CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),in_stack_ffffffffffffeea0
            );
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                *)in_stack_ffffffffffffeeb0,
               (key_type *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
             CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),in_stack_ffffffffffffeea0
            );
  this_00 = (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)operator_new(0x4a8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffee88);
  __x = (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88,
        (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)0xe72f40);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffee98);
  CWallet::CWallet(pCVar6,(Chain *)chain,(string *)CONCAT17(uVar3,in_stack_ffffffffffffefa0),
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)database);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88,(CWallet *)0xe72f9d);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffee90,(char (*) [1])in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    local_c88._vptr_lazy_ostream._4_4_ =
         CWallet::LoadWallet((CWallet *)
                             CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
    local_c88._vptr_lazy_ostream._0_4_ = 9;
    in_stack_ffffffffffffee98 = "DBErrors::CORRUPT";
    in_stack_ffffffffffffee90 = &local_c88;
    in_stack_ffffffffffffee88 = "wallet->LoadWallet()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
              (local_c70,&local_c88.m_empty,0xc5,1,2,
               (undefined1 *)((long)&local_c88._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88);
  CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffee88);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,
               (size_t)in_stack_ffffffffffffeeb8,(const_string *)in_stack_ffffffffffffeeb0);
    CPubKey::IsValid((CPubKey *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffee98,
               SUB81((ulong)in_stack_ffffffffffffee90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee90,(basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    in_stack_ffffffffffffee88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cc0,local_ce0,local_d00,0xcc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee88);
    uVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar4);
  MakeSerializeData<std::__cxx11::string,CPubKey>
            (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
            ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                          *)in_stack_ffffffffffffeeb0,
                         (key_type *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=(this_00,__x);
  __s = (char *)operator_new(0x4a8);
  file = (const_string *)
         std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                   ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                    in_stack_ffffffffffffee88);
  __a = &local_d29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffee88,
        (map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)0xe73352);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffee98);
  CWallet::CWallet(pCVar6,(Chain *)chain,(string *)CONCAT17(uVar3,in_stack_ffffffffffffefa0),
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)database);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88,(CWallet *)0xe733a6);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee88);
  std::allocator<char>::~allocator(&local_d29);
  do {
    pCVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,(size_t)pCVar6,(const_string *)in_stack_ffffffffffffeeb0)
    ;
    in_stack_ffffffffffffeeb0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffee90,(char (*) [1])in_stack_ffffffffffffee88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
               (pointer)in_stack_ffffffffffffee90,(unsigned_long)in_stack_ffffffffffffee88);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffee88);
    local_d90._vptr_lazy_ostream._4_4_ =
         CWallet::LoadWallet((CWallet *)CONCAT17(uVar4,in_stack_ffffffffffffeee0));
    local_d90._vptr_lazy_ostream._0_4_ = 9;
    in_stack_ffffffffffffee98 = "DBErrors::CORRUPT";
    in_stack_ffffffffffffee90 = &local_d90;
    in_stack_ffffffffffffee88 = "wallet->LoadWallet()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
              (local_d78,&local_d90.m_empty,0xd1,1,2,
               (undefined1 *)((long)&local_d90._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee98);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffee88);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee98);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)in_stack_ffffffffffffee98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_load_ckey, TestingSetup)
{
    SerializeData ckey_record_key;
    SerializeData ckey_record_value;
    MockableData records;

    {
        // Context setup.
        // Create and encrypt legacy wallet
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase()));
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));

        // Retrieve a key
        CTxDestination dest = *Assert(legacy_spkm->GetNewDestination(OutputType::LEGACY));
        CKeyID key_id = GetKeyForDestination(*legacy_spkm, dest);
        CKey first_key;
        BOOST_CHECK(legacy_spkm->GetKey(key_id, first_key));

        // Encrypt the wallet
        BOOST_CHECK(wallet->EncryptWallet("encrypt"));
        wallet->Flush();

        // Store a copy of all the records
        records = GetMockableDatabase(*wallet).m_records;

        // Get the record for the retrieved key
        ckey_record_key = MakeSerializeData(DBKeys::CRYPTED_KEY, first_key.GetPubKey());
        ckey_record_value = records.at(ckey_record_key);
    }

    {
        // First test case:
        // Erase all the crypted keys from db and unlock the wallet.
        // The wallet will only re-write the crypted keys to db if any checksum is missing at load time.
        // So, if any 'ckey' record re-appears on db, then the checksums were not properly calculated, and we are re-writing
        // the records every time that 'CWallet::Unlock' gets called, which is not good.

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all records and check that the 'Unlock' function doesn't re-write them
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Second test case:
        // Verify that loading up a 'ckey' with no checksum triggers a complete re-write of the crypted keys.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all ckey records and check that the 'Unlock' function re-writes them
        // (this is because the wallet, at load time, found a ckey record with no checksum)
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Third test case:
        // Verify that loading up a 'ckey' with an invalid checksum throws an error.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);
        // Fill in the checksum space with 0s
        records[ckey_record_key].resize(ckey_record_value.size());

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }

    {
        // Fourth test case:
        // Verify that loading up a 'ckey' with an invalid pubkey throws an error
        CPubKey invalid_key;
        BOOST_CHECK(!invalid_key.IsValid());
        SerializeData key = MakeSerializeData(DBKeys::CRYPTED_KEY, invalid_key);
        records[key] = ckey_record_value;

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }
}